

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O3

void __thiscall
tchecker::
intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::reset
          (intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
           *this,make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *t)

{
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar1;
  loc_array_t lVar2;
  underflow_error *this_00;
  code *pcVar3;
  undefined *puVar4;
  
  if ((t != (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) &&
     (lVar2 = (loc_array_t)((long)t[-1].super_vloc_t.super_loc_array_t + 1),
     t[-1].super_vloc_t.super_loc_array_t = lVar2, lVar2 == (loc_array_t)0xfffffffffffffffe)) {
    this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error((overflow_error *)this_00,"reference counter overflow");
    puVar4 = &std::overflow_error::typeinfo;
    pcVar3 = std::overflow_error::~overflow_error;
LAB_0017325f:
    __cxa_throw(this_00,puVar4,pcVar3);
  }
  pmVar1 = this->_t;
  if (pmVar1 != (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
    if (*(loc_array_t *)(pmVar1 + -1) == (loc_array_t)0x0) {
      this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
      std::underflow_error::underflow_error(this_00,"reference counter underflow");
      puVar4 = &std::underflow_error::typeinfo;
      pcVar3 = std::underflow_error::~underflow_error;
      goto LAB_0017325f;
    }
    pmVar1[-1].super_vloc_t.super_loc_array_t =
         (loc_array_t)((long)*(loc_array_t *)(pmVar1 + -1) + -1);
  }
  this->_t = t;
  return;
}

Assistant:

inline void reset(T * t = nullptr)
  {
    if (t != nullptr)
      t->take_reference();
    if (_t != nullptr)
      _t->release_reference();
    _t = t;
  }